

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O2

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule
          (LubyRestartsSchedule *this,LubyRestartsSchedule *other)

{
  difference_type __d;
  ptrdiff_t pVar1;
  
  (this->super_RestartsSchedule)._vptr_RestartsSchedule =
       (_func_int **)&PTR__LubyRestartsSchedule_0018c578;
  this->_backtracks_remaining = other->_backtracks_remaining;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list
            (&this->_sequence,&other->_sequence);
  (this->_current_sequence)._M_node =
       (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
       super__List_node_base._M_next;
  pVar1 = std::__distance<long_long>
                    ((other->_sequence).super__List_base<long_long,_std::allocator<long_long>_>.
                     _M_impl._M_node.super__List_node_base._M_next,
                     (other->_current_sequence)._M_node);
  std::__advance<std::_List_const_iterator<long_long>,long>(&this->_current_sequence,pVar1);
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(const LubyRestartsSchedule & other) :
    _backtracks_remaining(other._backtracks_remaining),
    _sequence(other._sequence),
    _current_sequence(_sequence.begin())
{
    advance(_current_sequence, distance(other._sequence.begin(), other._current_sequence));
}